

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

int portability_path_is_pattern(char *path,size_t size)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 1;
  if (size != 0 && path != (char *)0x0) {
    uVar3 = 0;
    do {
      if (size <= uVar3) {
        return 1;
      }
      pcVar1 = path + uVar3;
      if (*pcVar1 == '\0') {
        return 1;
      }
      uVar3 = uVar3 + 1;
    } while (*pcVar1 != '*');
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int portability_path_is_pattern(const char *path, size_t size)
{
	if (path == NULL || size == 0)
	{
		return 1;
	}

	size_t i;

	for (i = 0; path[i] != '\0' && i < size; ++i)
	{
		if (path[i] == '*')
		{
			return 0;
		}
	}

	return 1;
}